

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void fillRegion(QPainter *painter,QRegion *rgn,QBrush *brush)

{
  QRect QVar1;
  int iVar2;
  int h;
  QPoint QVar3;
  long lVar4;
  long *plVar5;
  QBrush *pQVar6;
  QBrush *pQVar7;
  QRect *rect;
  long in_FS_OFFSET;
  QPoint local_68;
  QPixmap local_60 [24];
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(*(long *)brush + 4) == 0x18) {
    local_48 = (QRect)QRegion::boundingRect();
    QVar3 = local_48._0_8_;
    QPainter::setClipRegion((QRegion *)painter,(ClipOperation)rgn);
    QBrush::texture();
    local_68 = QVar3;
    QPainter::drawTiledPixmap(painter,&local_48,local_60,&local_68);
    QPixmap::~QPixmap(local_60);
    QVar1 = local_48;
  }
  else {
    lVar4 = QBrush::gradient();
    if (lVar4 != 0) {
      QBrush::gradient();
      iVar2 = QGradient::coordinateMode();
      if (iVar2 != 2) {
        QBrush::gradient();
        iVar2 = QGradient::coordinateMode();
        if (iVar2 != 3) goto LAB_002f4504;
      }
      QPainter::save();
      QPainter::setClipRegion((QRegion *)painter,(ClipOperation)rgn);
      plVar5 = (long *)QPainter::device();
      iVar2 = (**(code **)(*plVar5 + 0x20))(plVar5,1);
      plVar5 = (long *)QPainter::device();
      h = (**(code **)(*plVar5 + 0x20))(plVar5);
      QPainter::fillRect(painter,0,0,iVar2,h,brush);
      QVar1.x2.m_i = local_48.x2.m_i;
      QVar1.y2.m_i = local_48.y2.m_i;
      QVar1.x1.m_i = local_48.x1.m_i;
      QVar1.y1.m_i = local_48.y1.m_i;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QPainter::restore();
        return;
      }
      goto LAB_002f4537;
    }
LAB_002f4504:
    pQVar6 = (QBrush *)QRegion::begin();
    pQVar7 = (QBrush *)QRegion::end();
    for (; QVar1.x2.m_i = local_48.x2.m_i, QVar1.y2.m_i = local_48.y2.m_i,
        QVar1.x1.m_i = local_48.x1.m_i, QVar1.y1.m_i = local_48.y1.m_i, pQVar6 != pQVar7;
        pQVar6 = pQVar6 + 0x10) {
      QPainter::fillRect((QRect *)painter,pQVar6);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002f4537:
  local_48 = QVar1;
  __stack_chk_fail();
}

Assistant:

static inline void fillRegion(QPainter *painter, const QRegion &rgn, const QBrush &brush)
{
    Q_ASSERT(painter);

    if (brush.style() == Qt::TexturePattern) {
        const QRect rect(rgn.boundingRect());
        painter->setClipRegion(rgn);
        painter->drawTiledPixmap(rect, brush.texture(), rect.topLeft());
    } else if (brush.gradient()
               && (brush.gradient()->coordinateMode() == QGradient::ObjectBoundingMode
                   || brush.gradient()->coordinateMode() == QGradient::ObjectMode)) {
        painter->save();
        painter->setClipRegion(rgn);
        painter->fillRect(0, 0, painter->device()->width(), painter->device()->height(), brush);
        painter->restore();
    } else {
        for (const QRect &rect : rgn)
            painter->fillRect(rect, brush);
    }
}